

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

NULLCRef * NULLC::ReplaceObject(NULLCRef l,NULLCRef r)

{
  uint uVar1;
  uint uVar2;
  char *__function;
  NULLCRef *in_RDI;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_00000010;
  uint in_stack_00000018;
  undefined4 in_stack_0000001c;
  
  if (in_stack_00000008 == in_stack_00000018) {
    if (in_stack_00000008 < *(uint *)(linker + 0x20c)) {
      memcpy((void *)CONCAT44(in_stack_00000010,in_stack_0000000c),
             (void *)CONCAT44(l.typeID,in_stack_0000001c),
             (ulong)*(uint *)(*(long *)(linker + 0x200) + 4 + (ulong)in_stack_00000008 * 0x50));
LAB_0011e3b0:
      *(undefined4 *)((long)&in_RDI->ptr + 4) = in_stack_00000010;
      *(ulong *)in_RDI = CONCAT44(in_stack_0000000c,in_stack_00000008);
      return in_RDI;
    }
  }
  else if (in_stack_00000018 < *(uint *)(linker + 0x20c)) {
    uVar1 = *(uint *)(*(long *)(linker + 0x200) + (ulong)in_stack_00000018 * 0x50);
    if (uVar1 < *(uint *)(linker + 0x29c)) {
      if (*(uint *)(linker + 0x20c) <= in_stack_00000008) goto LAB_0011e3c8;
      uVar2 = *(uint *)(*(long *)(linker + 0x200) + (ulong)in_stack_00000008 * 0x50);
      if (uVar2 < *(uint *)(linker + 0x29c)) {
        nullcThrowError("ERROR: cannot convert from %s ref to %s ref",
                        (ulong)uVar1 + *(long *)(linker + 0x290),
                        (ulong)uVar2 + *(long *)(linker + 0x290));
        goto LAB_0011e3b0;
      }
    }
    __function = 
    "T &FastVector<char>::operator[](unsigned int) [T = char, zeroNewMemory = false, skipConstructor = false]"
    ;
    goto LAB_0011e3f4;
  }
LAB_0011e3c8:
  __function = 
  "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
  ;
LAB_0011e3f4:
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x7f,__function);
}

Assistant:

NULLCRef NULLC::ReplaceObject(NULLCRef l, NULLCRef r)
{
	if(l.typeID != r.typeID)
	{
		nullcThrowError("ERROR: cannot convert from %s ref to %s ref", &linker->exSymbols[linker->exTypes[r.typeID].offsetToName], &linker->exSymbols[linker->exTypes[l.typeID].offsetToName]);
		return l;
	}
	memcpy(l.ptr, r.ptr, linker->exTypes[r.typeID].size);
	return l;
}